

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

void Abc_SclTimeIncCheckLevel(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Abc_Obj_t *pObj;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    uVar4 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[uVar4];
      if (pObj != (Abc_Obj_t *)0x0) {
        uVar1 = *(uint *)&pObj->field_0x14;
        uVar2 = Abc_ObjLevelNew(pObj);
        if (uVar1 >> 0xc != uVar2) {
          printf("Level of node %d is out of date!\n",uVar4 & 0xffffffff);
        }
      }
      uVar4 = uVar4 + 1;
      pVVar3 = pNtk->vObjs;
    } while ((long)uVar4 < (long)pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_SclTimeIncCheckLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( (int)pObj->Level != Abc_ObjLevelNew(pObj) )
            printf( "Level of node %d is out of date!\n", i );
}